

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O1

void av1_dr_prediction_z3_c
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_left,int dx,int dy)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  uint8_t *puVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  uint8_t *local_40;
  
  if (0 < bw) {
    bVar2 = (byte)upsample_left;
    lVar5 = (long)(bw + bh + -1 << (bVar2 & 0x1f));
    uVar9 = 0;
    iVar6 = dy;
    local_40 = dst;
    do {
      if (0 < bh) {
        bVar1 = 6 - bVar2 & 0x1f;
        uVar10 = (uint)(iVar6 << (bVar2 & 0x1f)) >> 1 & 0x1f;
        lVar8 = (long)(iVar6 >> bVar1);
        uVar4 = (ulong)(uint)(0 >> bVar1);
        uVar3 = (ulong)(uint)bh;
        puVar7 = local_40;
        do {
          if (lVar5 <= lVar8) {
            if ((int)uVar4 < bh) {
              do {
                *puVar7 = left[lVar5];
                puVar7 = puVar7 + stride;
                uVar3 = uVar3 - 1;
              } while (uVar3 != 0);
            }
            break;
          }
          *puVar7 = (uint8_t)((uint)left[lVar8] * (0x20 - uVar10) + left[lVar8 + 1] * uVar10 + 0x10
                             >> 5);
          uVar4 = uVar4 + 1;
          lVar8 = lVar8 + (1 << (bVar2 & 0x1f));
          puVar7 = puVar7 + stride;
          uVar3 = uVar3 - 1;
        } while ((uint)bh != uVar4);
      }
      uVar9 = uVar9 + 1;
      iVar6 = iVar6 + dy;
      local_40 = local_40 + 1;
    } while (uVar9 != (uint)bw);
  }
  return;
}

Assistant:

void av1_dr_prediction_z3_c(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                            const uint8_t *above, const uint8_t *left,
                            int upsample_left, int dx, int dy) {
  int r, c, y, base, shift, val;

  (void)above;
  (void)dx;

  assert(dx == 1);
  assert(dy > 0);

  const int max_base_y = (bw + bh - 1) << upsample_left;
  const int frac_bits = 6 - upsample_left;
  const int base_inc = 1 << upsample_left;
  y = dy;
  for (c = 0; c < bw; ++c, y += dy) {
    base = y >> frac_bits;
    shift = ((y << upsample_left) & 0x3F) >> 1;

    for (r = 0; r < bh; ++r, base += base_inc) {
      if (base < max_base_y) {
        val = left[base] * (32 - shift) + left[base + 1] * shift;
        dst[r * stride + c] = ROUND_POWER_OF_TWO(val, 5);
      } else {
        for (; r < bh; ++r) dst[r * stride + c] = left[max_base_y];
        break;
      }
    }
  }
}